

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O2

void __thiscall irr::video::CNullDriver::removeAllRenderTargets(CNullDriver *this)

{
  pointer ppIVar1;
  IRenderTarget *pIVar2;
  u32 i;
  ulong uVar3;
  
  for (uVar3 = 0;
      ppIVar1 = (this->RenderTargets).m_data.
                super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < ((ulong)((long)(this->RenderTargets).m_data.
                             super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3 &
              0xffffffff); uVar3 = uVar3 + 1) {
    pIVar2 = ppIVar1[uVar3];
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&pIVar2->_vptr_IRenderTarget +
               (long)pIVar2->_vptr_IRenderTarget[0xfffffffffffffffd]));
  }
  core::array<irr::video::IRenderTarget_*>::clear(&this->RenderTargets);
  this->SharedRenderTarget = (IRenderTarget *)0x0;
  return;
}

Assistant:

void CNullDriver::removeAllRenderTargets()
{
	for (u32 i = 0; i < RenderTargets.size(); ++i)
		RenderTargets[i]->drop();

	RenderTargets.clear();

	SharedRenderTarget = 0;
}